

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_view_field.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::cpp::anon_unknown_4::SingularStringView::
GenerateNonInlineAccessorDefinitions(SingularStringView *this,Printer *p)

{
  Printer *pPVar1;
  bool bVar2;
  basic_string_view<char,_std::char_traits<char>_> local_28;
  Printer *local_18;
  Printer *p_local;
  SingularStringView *this_local;
  
  local_18 = p;
  p_local = (Printer *)this;
  bVar2 = EmptyDefault(this);
  if ((!bVar2) && (bVar2 = use_micro_string(this), pPVar1 = local_18, !bVar2)) {
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (&local_28,
               "\n      /*static*/ const ::_pbi::LazyString $Msg$::$default_variable_field${\n          {{$kDefault$, $kDefaultLen$}},\n          {nullptr},\n      };\n    "
              );
    io::Printer::SourceLocation::current();
    io::Printer::Emit(pPVar1,local_28._M_len,local_28._M_str);
  }
  return;
}

Assistant:

void GenerateNonInlineAccessorDefinitions(io::Printer* p) const override {
    if (EmptyDefault() || use_micro_string()) return;
    p->Emit(R"cc(
      /*static*/ const ::_pbi::LazyString $Msg$::$default_variable_field${
          {{$kDefault$, $kDefaultLen$}},
          {nullptr},
      };
    )cc");
  }